

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketsOps.cpp
# Opt level: O2

sz_event sznet::net::sockets::sz_create_eventfd(void)

{
  int iVar1;
  SourceFile file;
  Logger local_ff0;
  undefined1 local_20 [12];
  
  iVar1 = eventfd(0,0x80800);
  if (-1 < iVar1) {
    return iVar1;
  }
  Logger::SourceFile::SourceFile<101>
            ((SourceFile *)local_20,
             (char (*) [101])
             "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/SocketsOps.cpp"
            );
  file._12_4_ = 0;
  file.m_data = (char *)local_20._0_8_;
  file.m_size = local_20._8_4_;
  Logger::Logger(&local_ff0,file,0x1f7,false);
  LogStream::operator<<(&local_ff0.m_impl.m_stream,"Failed in eventfd");
  Logger::~Logger(&local_ff0);
  abort();
}

Assistant:

sz_event sz_create_eventfd()
{
	int evtfd = ::eventfd(0, EFD_NONBLOCK | EFD_CLOEXEC);
	if (evtfd < 0)
	{
		LOG_SYSERR << "Failed in eventfd";
		abort();
	}

	return evtfd;
}